

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O2

region_ptr __thiscall
cornelich::vanilla_index::index_for
          (vanilla_index *this,int32_t cycle,int32_t file_number,bool append)

{
  hashed_index<boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_boost::hash<std::tuple<int,_int>_>,_std::equal_to<std::tuple<int,_int>_>,_boost::multi_index::detail::nth_layer<2,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::hashed_unique_tag>
  *this_00;
  string *base_path;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  iterator i;
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  undefined8 *puVar5;
  char in_R8B;
  type *sequence_index;
  pair<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>_>,_bool>
  pVar6;
  region_ptr rVar7;
  undefined1 local_238 [16];
  undefined1 local_228 [12];
  __tuple_element_t<1UL,_tuple<int,_int>_> file_number_;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8 [47];
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000034,cycle);
  local_228[8] = in_R8B;
  util::spin_lock::lock((spin_lock *)((long)puVar5 + 0xc));
  local_228._0_4_ = (undefined4)CONCAT71(in_register_00000009,append);
  this_00 = (hashed_index<boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_boost::hash<std::tuple<int,_int>_>,_std::equal_to<std::tuple<int,_int>_>,_boost::multi_index::detail::nth_layer<2,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::hashed_unique_tag>
             *)(puVar5 + 6);
  local_228._4_4_ = file_number;
  i.node = (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
            *)boost::multi_index::detail::
              hashed_index<boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,boost::hash<std::tuple<int,int>>,std::equal_to<std::tuple<int,int>>,boost::multi_index::detail::nth_layer<2,std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_sequence,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,boost::multi_index::member<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>,std::tuple<int,int>,&std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>::first>,mpl_::na,mpl_::na>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<std::pair<std::tuple<int,int>,std::shared_ptr<cornelich::region>>>>,boost::mpl::v_item<cornelich::util::cache<std::tuple<int,int>,std::shared_ptr<cornelich::region>,cornelich::region_ptr_validator>::tag_key,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
              ::find<std::tuple<int,int>>(this_00,(tuple<int,_int> *)local_228);
  uVar3 = local_228._0_4_;
  if (i.node == (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
                 *)puVar5[5]) {
    file_number_ = local_228._0_4_;
    base_path = (string *)*puVar5;
    cycle_formatter::date_from_cycle_abi_cxx11_
              (&local_1d8,(cycle_formatter *)base_path[1]._M_string_length,
               (long)(int)local_228._4_4_);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::operator<<((ostream *)local_1a8,(string *)INDEX_FILE_NAME_PREFIX_abi_cxx11_);
    std::ostream::operator<<((ostream *)local_1a8,uVar3);
    std::__cxx11::stringbuf::str();
    make_file(&local_218,base_path,&local_1d8,&local_1f8,(bool)local_228[8]);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    if (local_218._M_string_length == 0) {
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_1b8._0_8_ = 1L << (*(byte *)(puVar5 + 1) & 0x3f);
      std::make_shared<cornelich::region,std::__cxx11::string&,long_long,int&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (longlong *)&local_218,(int *)local_1b8);
    }
    std::__cxx11::string::~string((string *)&local_218);
    uVar1 = local_238._8_8_;
    if ((pointer)local_238._0_8_ == (pointer)0x0) {
      this->m_settings = (vanilla_chronicle_settings *)0x0;
      local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      uVar2 = local_238._8_8_;
      local_238._8_4_ = (undefined4)uVar1;
      local_238[0xc] = SUB81(uVar1,4);
      local_238._13_3_ = SUB83(uVar1,5);
      this->m_index_block_size_bits = local_238._8_4_;
      this->m_lock = (mutex_t)local_238[0xc];
      *(undefined3 *)&this->field_0xd = local_238._13_3_;
      local_238._8_8_ = uVar2;
    }
    else {
      if ((ulong)puVar5[2] <= (ulong)puVar5[0xd]) {
        boost::multi_index::detail::
        sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
        ::pop_front((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                     *)this_00);
      }
      local_1b8._4_4_ = local_228._4_4_;
      local_1b8._0_4_ = (_Head_base<1UL,_int,_false>)(_Head_base<1UL,_int,_false>)local_228._0_4_;
      std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),
                 (__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)local_238);
      pVar6 = boost::multi_index::detail::
              sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
              ::push_back((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                           *)this_00,(value_type *)local_1b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1a8);
      std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((pVar6.first.node.node)->
                         super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                         ).
                         super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                         .
                         super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                         .space.data_ + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    boost::multi_index::detail::
    sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
    ::relocate((sequenced_index<boost::multi_index::detail::nth_layer<1,_std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_boost::multi_index::indexed_by<boost::multi_index::sequenced<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::hashed_unique<boost::multi_index::tag<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_key,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::tuple<int,_int>,_&std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>>::first>,_mpl_::na,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>,_boost::mpl::v_item<cornelich::util::cache<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>,_cornelich::region_ptr_validator>::tag_sequence,_boost::mpl::vector0<mpl_::na>,_0>_>
                *)this_00,
               (sequenced_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>_>
                *)puVar5[5],i);
    std::__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((i.node)->
                       super_hashed_index_node<boost::multi_index::detail::index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>_>
                       ).
                       super_index_node_base<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>,_std::allocator<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>_>
                       .
                       super_pod_value_holder<std::pair<std::tuple<int,_int>,_std::shared_ptr<cornelich::region>_>_>
                       .space.data_ + 8));
    _Var4._M_pi = extraout_RDX;
  }
  (((spin_lock *)((long)puVar5 + 0xc))->m_flag).super___atomic_flag_base._M_i = false;
  rVar7.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  rVar7.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (region_ptr)rVar7.super___shared_ptr<cornelich::region,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

region_ptr vanilla_index::index_for(std::int32_t cycle, std::int32_t file_number, bool append)
{
    std::lock_guard<mutex_t> lk(m_lock);
    auto key = std::make_pair(cycle, file_number);
    auto && creator = [this, append](const key_t & k)
    {
        auto cycle_ = std::get<0>(k);
        auto file_number_ = std::get<1>(k);
        auto && path = make_file(m_settings.path(),
                                 m_settings.cycle_format().date_from_cycle(cycle_),
                                 (util::streamer() << INDEX_FILE_NAME_PREFIX << file_number_).str(),
                                 append);
        return !path.empty()
                ? std::make_shared<region>(path, 1LL << m_index_block_size_bits, file_number_)
                : region_ptr();
    };

    return m_cache.get(key, creator);
}